

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

xmlHashTablePtr xmlHashCreate(int size)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  _xmlHashEntry *p_Var3;
  xmlHashTablePtr table;
  int size_local;
  
  table._4_4_ = size;
  if (size < 1) {
    table._4_4_ = 0x100;
  }
  pxVar2 = (xmlHashTablePtr)(*xmlMalloc)(0x20);
  if (pxVar2 != (xmlHashTablePtr)0x0) {
    pxVar2->dict = (xmlDictPtr)0x0;
    pxVar2->size = table._4_4_;
    pxVar2->nbElems = 0;
    p_Var3 = (_xmlHashEntry *)(*xmlMalloc)((long)table._4_4_ * 0x30);
    pxVar2->table = p_Var3;
    if (pxVar2->table != (_xmlHashEntry *)0x0) {
      memset(pxVar2->table,0,(long)table._4_4_ * 0x30);
      iVar1 = __xmlRandom();
      pxVar2->random_seed = iVar1;
      return pxVar2;
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlHashTablePtr)0x0;
}

Assistant:

xmlHashTablePtr
xmlHashCreate(int size) {
    xmlHashTablePtr table;

    if (size <= 0)
        size = 256;

    table = xmlMalloc(sizeof(xmlHashTable));
    if (table) {
        table->dict = NULL;
        table->size = size;
	table->nbElems = 0;
        table->table = xmlMalloc(size * sizeof(xmlHashEntry));
        if (table->table) {
	    memset(table->table, 0, size * sizeof(xmlHashEntry));
#ifdef HASH_RANDOMIZATION
            table->random_seed = __xmlRandom();
#endif
	    return(table);
        }
        xmlFree(table);
    }
    return(NULL);
}